

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

float xm_waveform(xm_waveform_type_t waveform,uint8_t step)

{
  int iVar1;
  byte bVar2;
  float fVar3;
  
  if (waveform < (XM_RAMP_UP_WAVEFORM|XM_RAMP_DOWN_WAVEFORM)) {
    bVar2 = step & 0x3f;
    switch(waveform) {
    case XM_SINE_WAVEFORM:
      fVar3 = sinf((float)bVar2 * 6.283184 * 0.015625);
      return -fVar3;
    case XM_RAMP_DOWN_WAVEFORM:
      iVar1 = 0x20 - (uint)bVar2;
      break;
    case XM_SQUARE_WAVEFORM:
      return *(float *)(&DAT_001055d4 + (ulong)(0x1f < bVar2) * 4);
    case XM_RANDOM_WAVEFORM:
      xm_waveform::next_rand = xm_waveform::next_rand * 0x41c64e6d + 0x3039;
      return (float)(xm_waveform::next_rand >> 0x10 & 0x7fff) * 6.1035156e-05 + -1.0;
    case XM_RAMP_UP_WAVEFORM:
      iVar1 = bVar2 - 0x20;
    }
    return (float)iVar1 * 0.03125;
  }
  return 0.0;
}

Assistant:

static float xm_waveform(xm_waveform_type_t waveform, uint8_t step) {
	static unsigned int next_rand = 24492;
	step %= 0x40;

	switch(waveform) {

	case XM_SINE_WAVEFORM:
		/* Why not use a table? For saving space, and because there's
		 * very very little actual performance gain. */
		return -sinf(2.f * 3.141592f * (float)step / (float)0x40);

	case XM_RAMP_DOWN_WAVEFORM:
		/* Ramp down: 1.0f when step = 0; -1.0f when step = 0x40 */
		return (float)(0x20 - step) / 0x20;

	case XM_SQUARE_WAVEFORM:
		/* Square with a 50% duty */
		return (step >= 0x20) ? 1.f : -1.f;

	case XM_RANDOM_WAVEFORM:
		/* Use the POSIX.1-2001 example, just to be deterministic
		 * across different machines */
		next_rand = next_rand * 1103515245 + 12345;
		return (float)((next_rand >> 16) & 0x7FFF) / (float)0x4000 - 1.f;

	case XM_RAMP_UP_WAVEFORM:
		/* Ramp up: -1.f when step = 0; 1.f when step = 0x40 */
		return (float)(step - 0x20) / 0x20;

	default:
		break;

	}

	return .0f;
}